

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBootstrapCommands2.cxx
# Opt level: O2

void GetBootstrapCommands2(vector<cmCommand_*,_std::allocator<cmCommand_*>_> *commands)

{
  cmTryRunCommand *pcVar1;
  cmTryRunCommand *local_38;
  
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688998;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688a20;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688aa8;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(0xb8);
  cmGetPropertyCommand::cmGetPropertyCommand((cmGetPropertyCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688b48;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688bd0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688ca0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688db0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688e38;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688ec0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(0x70);
  cmInstallCommand::cmInstallCommand((cmInstallCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(0xa8);
  cmInstallFilesCommand::cmInstallFilesCommand((cmInstallFilesCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689058;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_006890e0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689168;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689238;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689348;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_006893d0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689458;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_006894e0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689568;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_006895f0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689678;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689700;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689788;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689810;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(200);
  cmSetPropertyCommand::cmSetPropertyCommand((cmSetPropertyCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_006899a8;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689898;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689a48;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689920;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689ad0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00688d28;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689b58;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x60);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689be0;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(0xb8);
  cmTryCompileCommand::cmTryCompileCommand((cmTryCompileCommand *)pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  pcVar1 = (cmTryRunCommand *)operator_new(0x158);
  cmTryRunCommand::cmTryRunCommand(pcVar1);
  local_38 = pcVar1;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689d78;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  local_38 = (cmTryRunCommand *)operator_new(0x50);
  (local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
  super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl + 8
   ) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_38->super_cmCoreTryCompile).super_cmCommand.Helper.Arguments.
           super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl +
   0x10) = (pointer)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_dataplus._M_p =
       (pointer)&(local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error._M_string_length = 0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Error.field_2._M_local_buf[0] = '\0';
  (local_38->super_cmCoreTryCompile).super_cmCommand.Makefile = (cmMakefile *)0x0;
  (local_38->super_cmCoreTryCompile).super_cmCommand.Enabled = true;
  (local_38->super_cmCoreTryCompile).super_cmCommand.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCommand_00689e00;
  std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
            ((vector<cmCommand*,std::allocator<cmCommand*>> *)commands,(cmCommand **)&local_38);
  return;
}

Assistant:

void GetBootstrapCommands2(std::vector<cmCommand*>& commands)
{
  commands.push_back(new cmGetCMakePropertyCommand);
  commands.push_back(new cmGetDirectoryPropertyCommand);
  commands.push_back(new cmGetFilenameComponentCommand);
  commands.push_back(new cmGetPropertyCommand);
  commands.push_back(new cmGetSourceFilePropertyCommand);
  commands.push_back(new cmGetTargetPropertyCommand);
  commands.push_back(new cmIfCommand);
  commands.push_back(new cmIncludeCommand);
  commands.push_back(new cmIncludeDirectoryCommand);
  commands.push_back(new cmIncludeRegularExpressionCommand);
  commands.push_back(new cmInstallCommand);
  commands.push_back(new cmInstallFilesCommand);
  commands.push_back(new cmInstallTargetsCommand);
  commands.push_back(new cmLinkDirectoriesCommand);
  commands.push_back(new cmListCommand);
  commands.push_back(new cmMacroCommand);
  commands.push_back(new cmMakeDirectoryCommand);
  commands.push_back(new cmMarkAsAdvancedCommand);
  commands.push_back(new cmMathCommand);
  commands.push_back(new cmMessageCommand);
  commands.push_back(new cmOptionCommand);
  commands.push_back(new cmProjectCommand);
  commands.push_back(new cmReturnCommand);
  commands.push_back(new cmSeparateArgumentsCommand);
  commands.push_back(new cmSetCommand);
  commands.push_back(new cmSetDirectoryPropertiesCommand);
  commands.push_back(new cmSetPropertyCommand);
  commands.push_back(new cmSetSourceFilesPropertiesCommand);
  commands.push_back(new cmSetTargetPropertiesCommand);
  commands.push_back(new cmGetTestPropertyCommand);
  commands.push_back(new cmSetTestsPropertiesCommand);
  commands.push_back(new cmSiteNameCommand);
  commands.push_back(new cmStringCommand);
  commands.push_back(new cmSubdirCommand);
  commands.push_back(new cmTargetLinkLibrariesCommand);
  commands.push_back(new cmTryCompileCommand);
  commands.push_back(new cmTryRunCommand);
  commands.push_back(new cmUnsetCommand);
  commands.push_back(new cmWhileCommand);
}